

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::qualConstraintViolation
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *maxviol,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *sumviol)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  pointer pnVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  Item *pIVar14;
  cpp_dec_float<100U,_int,_void> *pcVar15;
  cpp_dec_float<100U,_int,_void> *pcVar16;
  cpp_dec_float<100U,_int,_void> *v;
  long lVar17;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  viol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  solu;
  cpp_dec_float<100U,_int,_void> local_198;
  cpp_dec_float<100U,_int,_void> local_148;
  cpp_dec_float<100U,_int,_void> local_f8;
  cpp_dec_float<100U,_int,_void> local_a8;
  cpp_dec_float<100U,_int,_void> *local_50;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_48;
  
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)maxviol,0.0);
  local_50 = &sumviol->m_backend;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)sumviol,0.0);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_48,
               (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x60])(this,&local_48);
  if (0 < (this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar13 = 0;
    do {
      pIVar14 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem +
                (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[lVar13].idx;
      local_148.fpclass = cpp_dec_float_finite;
      local_148.prec_elem = 0x10;
      local_148.data._M_elems[0] = 0;
      local_148.data._M_elems[1] = 0;
      local_148.data._M_elems[2] = 0;
      local_148.data._M_elems[3] = 0;
      local_148.data._M_elems[4] = 0;
      local_148.data._M_elems[5] = 0;
      local_148.data._M_elems[6] = 0;
      local_148.data._M_elems[7] = 0;
      local_148.data._M_elems[8] = 0;
      local_148.data._M_elems[9] = 0;
      local_148.data._M_elems[10] = 0;
      local_148.data._M_elems[0xb] = 0;
      local_148.data._M_elems[0xc] = 0;
      local_148.data._M_elems[0xd] = 0;
      local_148.data._M_elems._56_5_ = 0;
      local_148.data._M_elems[0xf]._1_3_ = 0;
      local_148.exp = 0;
      local_148.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_148,0.0);
      if (0 < (pIVar14->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        lVar17 = 0;
        lVar12 = 0;
        do {
          pNVar1 = (pIVar14->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pcVar16 = &local_48.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)(&pNVar1->val + 1) + lVar17)].m_backend;
          pcVar15 = (cpp_dec_float<100U,_int,_void> *)
                    ((long)(pNVar1->val).m_backend.data._M_elems + lVar17);
          local_198.fpclass = cpp_dec_float_finite;
          local_198.prec_elem = 0x10;
          local_198.data._M_elems[0] = 0;
          local_198.data._M_elems[1] = 0;
          local_198.data._M_elems[2] = 0;
          local_198.data._M_elems[3] = 0;
          local_198.data._M_elems[4] = 0;
          local_198.data._M_elems[5] = 0;
          local_198.data._M_elems[6] = 0;
          local_198.data._M_elems[7] = 0;
          local_198.data._M_elems[8] = 0;
          local_198.data._M_elems[9] = 0;
          local_198.data._M_elems[10] = 0;
          local_198.data._M_elems[0xb] = 0;
          local_198.data._M_elems[0xc] = 0;
          local_198.data._M_elems[0xd] = 0;
          local_198.data._M_elems._56_5_ = 0;
          local_198.data._M_elems[0xf]._1_3_ = 0;
          local_198.exp = 0;
          local_198.neg = false;
          v = pcVar15;
          if ((&local_198 != pcVar16) && (v = pcVar16, pcVar15 != &local_198)) {
            uVar3 = *(undefined8 *)(pcVar15->data)._M_elems;
            uVar4 = *(undefined8 *)((pcVar15->data)._M_elems + 2);
            uVar5 = *(undefined8 *)((pcVar15->data)._M_elems + 4);
            uVar6 = *(undefined8 *)((pcVar15->data)._M_elems + 6);
            uVar7 = *(undefined8 *)((pcVar15->data)._M_elems + 8);
            uVar8 = *(undefined8 *)((pcVar15->data)._M_elems + 10);
            uVar9 = *(undefined8 *)((pcVar15->data)._M_elems + 0xc);
            uVar10 = *(undefined8 *)((pcVar15->data)._M_elems + 0xe);
            local_198.data._M_elems[0xc] = (uint)uVar9;
            local_198.data._M_elems[0xd] = (uint)((ulong)uVar9 >> 0x20);
            local_198.data._M_elems._56_5_ = SUB85(uVar10,0);
            local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
            local_198.data._M_elems[8] = (uint)uVar7;
            local_198.data._M_elems[9] = (uint)((ulong)uVar7 >> 0x20);
            local_198.data._M_elems[10] = (uint)uVar8;
            local_198.data._M_elems[0xb] = (uint)((ulong)uVar8 >> 0x20);
            local_198.data._M_elems[4] = (uint)uVar5;
            local_198.data._M_elems[5] = (uint)((ulong)uVar5 >> 0x20);
            local_198.data._M_elems[6] = (uint)uVar6;
            local_198.data._M_elems[7] = (uint)((ulong)uVar6 >> 0x20);
            local_198.data._M_elems[0] = (uint)uVar3;
            local_198.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
            local_198.data._M_elems[2] = (uint)uVar4;
            local_198.data._M_elems[3] = (uint)((ulong)uVar4 >> 0x20);
            local_198.exp = *(int *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar17);
            local_198.neg = *(bool *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar17 + 4);
            local_198._72_8_ =
                 *(undefined8 *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar17 + 8);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_198,v);
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    (&local_148,&local_198);
          lVar12 = lVar12 + 1;
          lVar17 = lVar17 + 0x54;
        } while (lVar12 < (pIVar14->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
      local_198.fpclass = cpp_dec_float_finite;
      local_198.prec_elem = 0x10;
      local_198.data._M_elems[0] = 0;
      local_198.data._M_elems[1] = 0;
      local_198.data._M_elems[2] = 0;
      local_198.data._M_elems[3] = 0;
      local_198.data._M_elems[4] = 0;
      local_198.data._M_elems[5] = 0;
      local_198.data._M_elems[6] = 0;
      local_198.data._M_elems[7] = 0;
      local_198.data._M_elems[8] = 0;
      local_198.data._M_elems[9] = 0;
      local_198.data._M_elems[10] = 0;
      local_198.data._M_elems[0xb] = 0;
      local_198.data._M_elems[0xc] = 0;
      local_198.data._M_elems[0xd] = 0;
      local_198.data._M_elems._56_5_ = 0;
      local_198.data._M_elems[0xf]._1_3_ = 0;
      local_198.exp = 0;
      local_198.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_198,0.0);
      if ((local_148.fpclass == cpp_dec_float_NaN) ||
         (pnVar2 = (this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         pnVar2[lVar13].m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_00397b62:
        if (((local_148.fpclass != cpp_dec_float_NaN) &&
            (pnVar2 = (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            pnVar2[lVar13].m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&local_148,&pnVar2[lVar13].m_backend), 0 < iVar11)) {
          pcVar15 = &(this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar13].m_backend;
          local_f8.fpclass = cpp_dec_float_finite;
          local_f8.prec_elem = 0x10;
          local_f8.data._M_elems[0] = 0;
          local_f8.data._M_elems[1] = 0;
          local_f8.data._M_elems[2] = 0;
          local_f8.data._M_elems[3] = 0;
          local_f8.data._M_elems[4] = 0;
          local_f8.data._M_elems[5] = 0;
          local_f8.data._M_elems[6] = 0;
          local_f8.data._M_elems[7] = 0;
          local_f8.data._M_elems[8] = 0;
          local_f8.data._M_elems[9] = 0;
          local_f8.data._M_elems[10] = 0;
          local_f8.data._M_elems[0xb] = 0;
          local_f8.data._M_elems[0xc] = 0;
          local_f8.data._M_elems[0xd] = 0;
          local_f8.data._M_elems._56_5_ = 0;
          local_f8.data._M_elems[0xf]._1_3_ = 0;
          local_f8.exp = 0;
          local_f8.neg = false;
          if (&local_f8 == pcVar15) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_f8,&local_148);
            if (local_f8.fpclass == cpp_dec_float_finite && local_f8.data._M_elems[0] == 0) {
              local_198.data._M_elems[0] = 0;
              local_198.fpclass = cpp_dec_float_finite;
            }
            else {
              local_f8.neg = (bool)(local_f8.neg ^ 1);
              local_198.data._M_elems[0] = local_f8.data._M_elems[0];
              local_198.fpclass = local_f8.fpclass;
            }
          }
          else {
            local_f8.data._M_elems[0xc] = local_148.data._M_elems[0xc];
            local_f8.data._M_elems[0xd] = local_148.data._M_elems[0xd];
            local_f8.data._M_elems._56_5_ = local_148.data._M_elems._56_5_;
            local_f8.data._M_elems[0xf]._1_3_ = local_148.data._M_elems[0xf]._1_3_;
            local_f8.data._M_elems[8] = local_148.data._M_elems[8];
            local_f8.data._M_elems[9] = local_148.data._M_elems[9];
            local_f8.data._M_elems[10] = local_148.data._M_elems[10];
            local_f8.data._M_elems[0xb] = local_148.data._M_elems[0xb];
            local_f8.data._M_elems[4] = local_148.data._M_elems[4];
            local_f8.data._M_elems[5] = local_148.data._M_elems[5];
            local_f8.data._M_elems[6] = local_148.data._M_elems[6];
            local_f8.data._M_elems[7] = local_148.data._M_elems[7];
            local_f8.data._M_elems[0] = local_148.data._M_elems[0];
            local_f8.data._M_elems[1] = local_148.data._M_elems[1];
            local_f8.data._M_elems[2] = local_148.data._M_elems[2];
            local_f8.data._M_elems[3] = local_148.data._M_elems[3];
            local_f8.exp = local_148.exp;
            local_f8.neg = local_148.neg;
            local_f8.fpclass = local_148.fpclass;
            local_f8.prec_elem = local_148.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_f8,pcVar15);
            local_198.data._M_elems[0] = local_f8.data._M_elems[0];
            local_198.fpclass = local_f8.fpclass;
          }
          local_198.neg = local_f8.neg;
          if ((local_f8.neg & 1U) != 0) {
            local_198.neg =
                 (bool)(local_f8.neg ^
                       (local_198.fpclass != cpp_dec_float_finite || local_198.data._M_elems[0] != 0
                       ));
          }
          pcVar15 = &local_f8;
          local_198.exp = local_f8.exp;
          local_198.prec_elem = local_f8.prec_elem;
          goto LAB_00397e11;
        }
      }
      else {
        iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_148,&pnVar2[lVar13].m_backend);
        if (-1 < iVar11) {
          goto LAB_00397b62;
        }
        pcVar15 = &(this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar13].m_backend;
        local_a8.fpclass = cpp_dec_float_finite;
        local_a8.prec_elem = 0x10;
        local_a8.data._M_elems[0] = 0;
        local_a8.data._M_elems[1] = 0;
        local_a8.data._M_elems[2] = 0;
        local_a8.data._M_elems[3] = 0;
        local_a8.data._M_elems[4] = 0;
        local_a8.data._M_elems[5] = 0;
        local_a8.data._M_elems[6] = 0;
        local_a8.data._M_elems[7] = 0;
        local_a8.data._M_elems[8] = 0;
        local_a8.data._M_elems[9] = 0;
        local_a8.data._M_elems[10] = 0;
        local_a8.data._M_elems[0xb] = 0;
        local_a8.data._M_elems[0xc] = 0;
        local_a8.data._M_elems[0xd] = 0;
        local_a8.data._M_elems._56_5_ = 0;
        local_a8.data._M_elems[0xf]._1_3_ = 0;
        local_a8.exp = 0;
        local_a8.neg = false;
        if (&local_a8 == pcVar15) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_a8,&local_148);
          if (local_a8.fpclass == cpp_dec_float_finite && local_a8.data._M_elems[0] == 0) {
            local_198.data._M_elems[0] = 0;
            local_198.fpclass = cpp_dec_float_finite;
          }
          else {
            local_a8.neg = (bool)(local_a8.neg ^ 1);
            local_198.data._M_elems[0] = local_a8.data._M_elems[0];
            local_198.fpclass = local_a8.fpclass;
          }
        }
        else {
          local_a8.data._M_elems[0xc] = local_148.data._M_elems[0xc];
          local_a8.data._M_elems[0xd] = local_148.data._M_elems[0xd];
          local_a8.data._M_elems._56_5_ = local_148.data._M_elems._56_5_;
          local_a8.data._M_elems[0xf]._1_3_ = local_148.data._M_elems[0xf]._1_3_;
          local_a8.data._M_elems[8] = local_148.data._M_elems[8];
          local_a8.data._M_elems[9] = local_148.data._M_elems[9];
          local_a8.data._M_elems[10] = local_148.data._M_elems[10];
          local_a8.data._M_elems[0xb] = local_148.data._M_elems[0xb];
          local_a8.data._M_elems[4] = local_148.data._M_elems[4];
          local_a8.data._M_elems[5] = local_148.data._M_elems[5];
          local_a8.data._M_elems[6] = local_148.data._M_elems[6];
          local_a8.data._M_elems[7] = local_148.data._M_elems[7];
          local_a8.data._M_elems[0] = local_148.data._M_elems[0];
          local_a8.data._M_elems[1] = local_148.data._M_elems[1];
          local_a8.data._M_elems[2] = local_148.data._M_elems[2];
          local_a8.data._M_elems[3] = local_148.data._M_elems[3];
          local_a8.exp = local_148.exp;
          local_a8.neg = local_148.neg;
          local_a8.fpclass = local_148.fpclass;
          local_a8.prec_elem = local_148.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_a8,pcVar15);
          local_198.data._M_elems[0] = local_a8.data._M_elems[0];
          local_198.fpclass = local_a8.fpclass;
        }
        local_198.neg = local_a8.neg;
        if ((local_a8.neg & 1U) != 0) {
          local_198.neg =
               (bool)(local_a8.neg ^
                     (local_198.fpclass != cpp_dec_float_finite || local_198.data._M_elems[0] != 0))
          ;
        }
        pcVar15 = &local_a8;
        local_198.exp = local_a8.exp;
        local_198.prec_elem = local_a8.prec_elem;
LAB_00397e11:
        uVar3 = *(undefined8 *)((pcVar15->data)._M_elems + 1);
        uVar4 = *(undefined8 *)((pcVar15->data)._M_elems + 3);
        uVar5 = *(undefined8 *)((pcVar15->data)._M_elems + 5);
        uVar6 = *(undefined8 *)((pcVar15->data)._M_elems + 7);
        uVar7 = *(undefined8 *)((pcVar15->data)._M_elems + 9);
        uVar8 = *(undefined8 *)((pcVar15->data)._M_elems + 0xb);
        uVar9 = *(undefined8 *)((pcVar15->data)._M_elems + 0xe);
        local_198.data._M_elems[0xd] =
             (uint)((ulong)*(undefined8 *)((pcVar15->data)._M_elems + 0xc) >> 0x20);
        local_198.data._M_elems._56_5_ = SUB85(uVar9,0);
        local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
        local_198.data._M_elems[9] = (uint)uVar7;
        local_198.data._M_elems[10] = (uint)((ulong)uVar7 >> 0x20);
        local_198.data._M_elems[0xb] = (uint)uVar8;
        local_198.data._M_elems[0xc] = (uint)((ulong)uVar8 >> 0x20);
        local_198.data._M_elems[5] = (uint)uVar5;
        local_198.data._M_elems[6] = (uint)((ulong)uVar5 >> 0x20);
        local_198.data._M_elems[7] = (uint)uVar6;
        local_198.data._M_elems[8] = (uint)((ulong)uVar6 >> 0x20);
        local_198.data._M_elems[1] = (uint)uVar3;
        local_198.data._M_elems[2] = (uint)((ulong)uVar3 >> 0x20);
        local_198.data._M_elems[3] = (uint)uVar4;
        local_198.data._M_elems[4] = (uint)((ulong)uVar4 >> 0x20);
      }
      if (((local_198.fpclass != cpp_dec_float_NaN) &&
          ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_198,&maxviol->m_backend), 0 < iVar11)) {
        *(ulong *)((maxviol->m_backend).data._M_elems + 0xc) =
             CONCAT44(local_198.data._M_elems[0xd],local_198.data._M_elems[0xc]);
        *(ulong *)((maxviol->m_backend).data._M_elems + 0xe) =
             CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_);
        *(ulong *)((maxviol->m_backend).data._M_elems + 8) =
             CONCAT44(local_198.data._M_elems[9],local_198.data._M_elems[8]);
        *(ulong *)((maxviol->m_backend).data._M_elems + 10) =
             CONCAT44(local_198.data._M_elems[0xb],local_198.data._M_elems[10]);
        *(ulong *)((maxviol->m_backend).data._M_elems + 4) =
             CONCAT44(local_198.data._M_elems[5],local_198.data._M_elems[4]);
        *(ulong *)((maxviol->m_backend).data._M_elems + 6) =
             CONCAT44(local_198.data._M_elems[7],local_198.data._M_elems[6]);
        *(ulong *)(maxviol->m_backend).data._M_elems =
             CONCAT44(local_198.data._M_elems[1],local_198.data._M_elems[0]);
        *(ulong *)((maxviol->m_backend).data._M_elems + 2) =
             CONCAT44(local_198.data._M_elems[3],local_198.data._M_elems[2]);
        (maxviol->m_backend).exp = local_198.exp;
        (maxviol->m_backend).neg = local_198.neg;
        (maxviol->m_backend).fpclass = local_198.fpclass;
        (maxviol->m_backend).prec_elem = local_198.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (local_50,&local_198);
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  if (local_48.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::qualConstraintViolation(R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   VectorBase<R> solu(this->nCols());

   getPrimalSol(solu);

   for(int row = 0; row < this->nRows(); ++row)
   {
      const SVectorBase<R>& rowvec = this->rowVector(row);

      R val = 0.0;

      for(int col = 0; col < rowvec.size(); ++col)
         val += rowvec.value(col) * solu[rowvec.index(col)];

      R viol = 0.0;

      assert(this->lhs(row) <= this->rhs(row) + 1e-9);

      if(val < this->lhs(row))
         viol = spxAbs(val - this->lhs(row));
      else if(val > this->rhs(row))
         viol = spxAbs(val - this->rhs(row));

      if(viol > maxviol)
         maxviol = viol;

      sumviol += viol;
   }
}